

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O1

void __thiscall Equality_invalidInput_Test::TestBody(Equality_invalidInput_Test *this)

{
  char cVar1;
  AssertionResult gtest_ar_;
  VariablePtr v1;
  long *local_68;
  AssertHelper local_60 [8];
  AssertionResult local_58;
  long local_48 [3];
  byte local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  shared_ptr *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_58._0_8_ = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"variable","");
  libcellml::Variable::create((string *)&local_20);
  if ((long *)local_58._0_8_ != local_48) {
    operator_delete((void *)local_58._0_8_,local_48[0] + 1);
  }
  local_58._0_8_ = (long *)0x0;
  local_58.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_30[0] = libcellml::Entity::equals(local_20);
  local_30[0] = local_30[0] ^ 1;
  local_28.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.message_.ptr_);
  }
  if (local_30[0] == 0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(char *)local_30,"v1->equals(nullptr)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x1b,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if ((long *)local_58._0_8_ != local_48) {
      operator_delete((void *)local_58._0_8_,local_48[0] + 1);
    }
    if (local_68 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_68 != (long *)0x0)) {
        (**(code **)(*local_68 + 8))();
      }
      local_68 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}